

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.h
# Opt level: O0

void __thiscall Cryptor::Cryptor(Cryptor *this,string *message)

{
  string *message_local;
  Cryptor *this_local;
  
  this->_vptr_Cryptor = (_func_int **)&PTR__Cryptor_00123c20;
  std::__cxx11::string::string((string *)&this->in_message_,(string *)message);
  std::__cxx11::string::string((string *)&this->out_message_);
  this->show_ = false;
  return;
}

Assistant:

explicit Cryptor(std::string message) : in_message_(std::move(message)) {}